

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEnumerableCore.hpp
# Opt level: O0

iterator * __thiscall
linq::IEnumerableCore<linq::IEnumerable<int_&>_>::end
          (iterator *__return_storage_ptr__,IEnumerableCore<linq::IEnumerable<int_&>_> *this)

{
  IEnumerable<int_&> local_30;
  IEnumerableCore<linq::IEnumerable<int_&>_> *local_18;
  IEnumerableCore<linq::IEnumerable<int_&>_> *this_local;
  
  local_18 = this;
  this_local = (IEnumerableCore<linq::IEnumerable<int_&>_> *)__return_storage_ptr__;
  IEnumerable<int_&>::IEnumerable(&local_30,&this->source);
  iterator::iterator(__return_storage_ptr__,&local_30,false);
  IEnumerable<int_&>::~IEnumerable(&local_30);
  return __return_storage_ptr__;
}

Assistant:

iterator end() { return iterator(source, false); }